

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

basic_string_view<char,_std::char_traits<char>_> * __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest::
MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__0>
          (DescriptorPoolMemoizationTest *this)

{
  MemoBase *pMVar1;
  MemoBase *from;
  GTestFlagSaver *pGVar2;
  bool bVar3;
  pointer prVar4;
  ulong uVar5;
  basic_string_view<char,_std::char_traits<char>_> *key_00;
  ReaderMutexLock lock;
  MutexLock lock_1;
  iterator it;
  iterator it_1;
  pair<const_void_*,_const_void_*> key;
  ReaderMutexLock local_70;
  MutexLock local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>::iterator,_bool>
  local_60;
  pair<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>
  local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  pMVar1 = (MemoBase *)this[1].super_Test._vptr_Test[3];
  key_00 = &local_30;
  local_30._M_str =
       &DescriptorPool::
        MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::$_0>(google::protobuf::FieldDescriptor_const*,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::$_0)
        ::type_key;
  local_70.mu_ = (Mutex *)pMVar1;
  local_30._M_len = (size_t)this;
  absl::lts_20250127::Mutex::ReaderLock((Mutex *)pMVar1);
  local_60.first =
       absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
       ::find<std::pair<void_const*,void_const*>>
                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
                   *)(((atomic<long> *)&pMVar1[1]._vptr_MemoBase)->super___atomic_base<long>)._M_i,
                  (key_arg<std::pair<const_void_*,_const_void_*>_> *)key_00);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
              *)(((atomic<long> *)&pMVar1[1]._vptr_MemoBase)->super___atomic_base<long>)._M_i);
  local_48.first.first = (void *)0x0;
  bVar3 = absl::lts_20250127::container_internal::operator!=(&local_60.first,(iterator *)&local_48);
  if (bVar3) {
    prVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
             ::iterator::operator->(&local_60.first);
    from = (prVar4->second)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>._M_head_impl;
    internal::
    AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::DescriptorPool::MemoBase>
              (from);
    key_00 = (basic_string_view<char,_std::char_traits<char>_> *)(from + 1);
  }
  absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock(&local_70);
  if (!bVar3) {
    std::
    make_unique<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>>
              ();
    pGVar2 = (this->super_Test).gtest_flag_saver_._M_t.
             super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
             .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
    uVar5 = (ulong)*(ushort *)&pGVar2->catch_exceptions_;
    (((atomic<long> *)&((MemoBase *)(local_70.mu_ + 1))->_vptr_MemoBase)->super___atomic_base<long>)
    ._M_i = uVar5;
    (((atomic<long> *)&((MemoBase *)(local_70.mu_ + 2))->_vptr_MemoBase)->super___atomic_base<long>)
    ._M_i = (__int_type_conflict)(&pGVar2->also_run_disabled_tests_ + ~uVar5);
    local_68.mu_ = (Mutex *)pMVar1;
    absl::lts_20250127::Mutex::Lock((Mutex *)pMVar1);
    local_48.second._M_t.
    super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
    .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>,_true,_true>
            )local_70.mu_;
    local_48.first.first = (void *)local_30._M_len;
    local_48.first.second = local_30._M_str;
    local_70.mu_ = (Mutex *)0x0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
    ::
    emplace<std::pair<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_0>
              (&local_60,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                *)(((atomic<long> *)&pMVar1[1]._vptr_MemoBase)->super___atomic_base<long>)._M_i,
               &local_48);
    if (local_48.second._M_t.
        super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
        .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
         )0x0) {
      (**(code **)((long)*(atomic<long> *)
                          local_48.second._M_t.
                          super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                          .
                          super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>
                          ._M_head_impl + 8))();
    }
    local_48.first.first = local_60.first.ctrl_;
    local_48.first.second = (void *)local_60.first.field_1;
    prVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
             ::iterator::operator->((iterator *)&local_48);
    pMVar1 = (prVar4->second)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>.
             _M_head_impl;
    internal::
    AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::DescriptorPool::MemoBase>
              (pMVar1);
    absl::lts_20250127::MutexLock::~MutexLock(&local_68);
    if (local_70.mu_ != (Mutex *)0x0) {
      (**(code **)(((local_70.mu_)->mu_).super___atomic_base<long>._M_i + 8))();
    }
    key_00 = (basic_string_view<char,_std::char_traits<char>_> *)(pMVar1 + 1);
  }
  return key_00;
}

Assistant:

const auto& MemoizeProjection(const Desc* descriptor, Func func) {
    return DescriptorPool::MemoizeProjection(descriptor, func);
  }